

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManPrintCuts(Of_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  uint nCutsAll;
  Vec_Int_t *vFirst;
  int *__s;
  Vec_Int_t *vCutNum;
  int *__s_00;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint *puVar16;
  int iVar17;
  
  pGVar6 = p->pGia;
  iVar2 = pGVar6->nObjs;
  vFirst = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  vFirst->nSize = 0;
  vFirst->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  vFirst->pArray = __s;
  vFirst->nSize = iVar2;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar2 * 4);
  }
  iVar7 = pGVar6->nObjs;
  vCutNum = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar8 = iVar7;
  }
  vCutNum->nSize = 0;
  vCutNum->nCap = iVar8;
  if (iVar8 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar8 << 2);
  }
  vCutNum->pArray = __s_00;
  vCutNum->nSize = iVar7;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0xff,(long)iVar7 * 4);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_01->pArray = piVar5;
  iVar8 = ~(pGVar6->vCos->nSize + pGVar6->vCis->nSize) + pGVar6->nObjs;
  Gia_ManFillValue(pGVar6);
  pGVar6 = p->pGia;
  if (pGVar6->nObjs < 1) {
    uVar14 = 0;
    nCutsAll = 0;
  }
  else {
    lVar12 = 0;
    nCutsAll = 0;
    uVar14 = 0;
    do {
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar6->pObjs + lVar12;
      uVar13 = *(uint *)pGVar1;
      if ((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) {
        uVar13 = (uint)uVar14;
        if (p->pObjs[lVar12].nRefs == 0) {
          puVar16 = (uint *)0x0;
        }
        else {
          Vec_IntPush(p_00,uVar13);
          if ((lVar12 == 0) || (p->pGia->nObjs <= lVar12)) {
            __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                          ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
          }
          uVar3 = p->pObjs[lVar12].iCutH;
          uVar9 = (int)uVar3 >> 0x10;
          if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) goto LAB_007888b9;
          puVar16 = (uint *)((ulong)((uVar3 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar9]);
        }
        pGVar1->Value = uVar13;
        if ((p->vCutSets).nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = (p->vCutSets).pArray[lVar12];
        uVar9 = (int)uVar3 >> 0x10;
        if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) {
LAB_007888b9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar4 = (p->vPages).pArray[uVar9];
        uVar10 = (ulong)(uVar3 & 0xffff);
        iVar17 = *(int *)((long)pvVar4 + uVar10 * 4);
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (iVar2 <= lVar12) {
LAB_007888d8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar15 = nCutsAll + iVar8;
        __s[lVar12] = iVar15;
        if (iVar7 <= lVar12) goto LAB_007888d8;
        uVar14 = (ulong)(uVar13 + 1);
        piVar5 = (int *)((long)pvVar4 + uVar10 * 4);
        __s_00[lVar12] = iVar17;
        if (0 < *piVar5) {
          puVar11 = (uint *)((long)pvVar4 + uVar10 * 4 + 4);
          iVar17 = 0;
          do {
            if (puVar16 == puVar11) {
              Vec_IntPush(p_01,iVar15 + iVar17);
            }
            iVar17 = iVar17 + 1;
            puVar11 = puVar11 + (ulong)(*puVar11 & 0x1f) + 4;
          } while (iVar17 < *piVar5);
          nCutsAll = nCutsAll + iVar17;
          uVar14 = (ulong)(uVar13 + 1);
        }
      }
      lVar12 = lVar12 + 1;
      pGVar6 = p->pGia;
    } while (lVar12 < pGVar6->nObjs);
  }
  if ((int)uVar14 != iVar8) {
    __assert_fail("nAndsAll == Shift",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                  ,0x68b,"void Of_ManPrintCuts(Of_Man_t *)");
  }
  printf("Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n",uVar14,(ulong)(uint)p_00->nSize,
         (ulong)nCutsAll);
  Of_ManCreateSat(p,nCutsAll,vFirst,vCutNum,p_00,p_01);
  if (__s != (int *)0x0) {
    free(__s);
    vFirst->pArray = (int *)0x0;
  }
  free(vFirst);
  if (__s_00 != (int *)0x0) {
    free(__s_00);
    vCutNum->pArray = (int *)0x0;
  }
  free(vCutNum);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  return;
}

Assistant:

void Of_ManPrintCuts( Of_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    int * pCutSet, * pCut, * pCutBest;
    int i, k, v, Var, nCuts;
    Vec_Int_t * vFirst  = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCutNum = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vBestNode = Vec_IntAlloc( 100 );
    Vec_Int_t * vBestCut  = Vec_IntAlloc( 100 );
    int nAndsAll = 0, nCutsAll = 0, Shift = Gia_ManAndNum(p->pGia);
    Gia_ManFillValue( p->pGia );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        // get the best cut
        pCutBest = NULL;
        if ( Of_ObjRefNum(p, i) )
        {
            Vec_IntPush( vBestNode, nAndsAll );
            pCutBest = Of_ObjCutBestP( p, i ); 
        }
        pObj->Value = nAndsAll++;
        // get the cutset
        pCutSet = Of_ObjCutSet(p, i);
        // count cuts
        nCuts = 0;
        Of_SetForEachCut( pCutSet, pCut, k )
            nCuts++;
        // save
        Vec_IntWriteEntry( vFirst,  i, Shift + nCutsAll );
        Vec_IntWriteEntry( vCutNum, i, nCuts );
        // print cuts
        if ( fVerbose )
            printf( "Node %d. Cuts %d.\n", i, nCuts );
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            if ( fVerbose )
            {
                printf( "{ " );
                Of_CutForEachVar( pCut, Var, v )
                    printf( "%d ", Var );
                printf( "} %s\n", pCutBest == pCut ? "best" :"" );
            }
            if ( pCutBest == pCut )
                Vec_IntPush( vBestCut, Shift + nCutsAll );
            nCutsAll++;
        }
    }
    assert( nAndsAll == Shift );
    printf( "Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n", nAndsAll, Vec_IntSize(vBestNode), nCutsAll );

    // create SAT problem
    Of_ManCreateSat( p, nCutsAll, vFirst, vCutNum, vBestNode, vBestCut );

    Vec_IntFree( vFirst );
    Vec_IntFree( vCutNum );
    Vec_IntFree( vBestNode );
    Vec_IntFree( vBestCut );
}